

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibAPI.h
# Opt level: O0

bool __thiscall
luna::StackAPI::CheckArgs<luna::ValueT,luna::ValueT,luna::ValueT>
          (StackAPI *this,int minCount,ValueT types,ValueT types_1,ValueT types_2)

{
  ValueT type;
  int in_ECX;
  undefined4 in_EDX;
  int in_ESI;
  StackAPI *in_RDI;
  int in_R8D;
  int params;
  int in_stack_ffffffffffffffcc;
  ValueT in_stack_ffffffffffffffd8;
  undefined1 local_1;
  
  type = GetStackSize(in_RDI);
  if ((int)type < in_ESI) {
    ArgCountError(in_RDI,in_stack_ffffffffffffffcc);
    local_1 = false;
  }
  else {
    local_1 = CheckArgs<luna::ValueT,luna::ValueT>
                        ((StackAPI *)CONCAT44(in_ESI,in_EDX),in_ECX,in_R8D,type,
                         in_stack_ffffffffffffffd8,(ValueT)((ulong)in_RDI >> 0x20));
  }
  return local_1;
}

Assistant:

bool CheckArgs(int minCount, ValueTypes... types)
        {
            // Check count of arguments
            auto params = GetStackSize();
            if (params < minCount)
            {
                ArgCountError(minCount);
                return false;
            }

            return CheckArgs(0, params, types...);
        }